

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OledBitmap.h
# Opt level: O0

void __thiscall SSD1306::OledBitmap<128,_64>::setPixel(OledBitmap<128,_64> *this,OledPoint p)

{
  OledPoint p_00;
  OledPoint p_01;
  bool bVar1;
  int iVar2;
  byte *pbVar3;
  OledPixel *in_RDI;
  PixelOffset offset;
  PixelOffset *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  undefined1 local_24;
  
  p_01.m_y = in_stack_ffffffffffffffd4;
  p_01.m_x = in_stack_ffffffffffffffd0;
  bVar1 = OledPixel::pixelInside(in_RDI,p_01);
  if (bVar1) {
    p_00.m_y = in_stack_ffffffffffffffc4;
    p_00.m_x = in_stack_ffffffffffffffc0;
    PixelOffset::PixelOffset(in_stack_ffffffffffffffb8,p_00);
    iVar2 = 1 << (local_24 & 0x1f);
    std::array<std::array<unsigned_char,_16UL>,_64UL>::operator[]
              ((array<std::array<unsigned_char,_16UL>,_64UL> *)
               CONCAT44(iVar2,in_stack_ffffffffffffffc0),(size_type)in_stack_ffffffffffffffb8);
    pbVar3 = std::array<unsigned_char,_16UL>::operator[]
                       ((array<unsigned_char,_16UL> *)CONCAT44(iVar2,in_stack_ffffffffffffffc0),
                        (size_type)in_stack_ffffffffffffffb8);
    *pbVar3 = *pbVar3 | (byte)iVar2;
  }
  return;
}

Assistant:

void
    setPixel(
        SSD1306::OledPoint p) override
    {
        if (not pixelInside(p))
        {
            return;
        }

        PixelOffset offset{p};

        blocks_[offset.block][offset.byte] |= (1 << offset.bit);
    }